

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O2

void __thiscall urllib::Request::parseUrl(Request *this)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  bool bVar7;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string tmp;
  
  psVar1 = &this->url_;
  lVar4 = std::__cxx11::string::find((char *)psVar1,0x10702f);
  if (lVar4 == -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
    pcVar5 = ": is not a valid URL.";
  }
  else {
    if ((this->url_)._M_string_length < 0x5dd) {
      iVar3 = std::__cxx11::string::compare((ulong)psVar1,0,(char *)0x7);
      if (iVar3 == 0) {
        bVar7 = true;
      }
      else {
        bVar7 = false;
        iVar3 = std::__cxx11::string::compare((ulong)psVar1,0,(char *)0x8);
        if (iVar3 != 0) {
          poVar6 = (ostream *)&std::cout;
          pcVar5 = "Only HTTP/HTTPS protocol is directly supported.";
          goto LAB_0010482e;
        }
      }
      this->isHTTP_ = bVar7;
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      if (bVar7 == false) {
        pcVar2 = (this->url_)._M_dataplus._M_p;
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_60,pcVar2 + 8,pcVar2 + (this->url_)._M_string_length);
      }
      else {
        pcVar2 = (this->url_)._M_dataplus._M_p;
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_60,pcVar2 + 7,pcVar2 + (this->url_)._M_string_length);
      }
      std::__cxx11::string::operator=((string *)&tmp,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      lVar4 = std::__cxx11::string::find((char *)&tmp,0x107031);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&this->host_);
        std::__cxx11::string::assign((char *)&this->uri_);
      }
      else {
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_60,tmp._M_dataplus._M_p,tmp._M_dataplus._M_p + lVar4);
        std::__cxx11::string::operator=((string *)&this->host_,(string *)local_60);
        std::__cxx11::string::~string((string *)local_60);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_60,tmp._M_dataplus._M_p + lVar4,
                   tmp._M_dataplus._M_p + tmp._M_string_length);
        std::__cxx11::string::operator=((string *)&this->uri_,(string *)local_60);
        std::__cxx11::string::~string((string *)local_60);
      }
      std::__cxx11::string::~string((string *)&tmp);
      return;
    }
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "url is too long.";
  }
LAB_0010482e:
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(2);
}

Assistant:

void Request::parseUrl()
{
    if (url_.find("://") == string::npos)
    {
        cout << url_ << ": is not a valid URL." << endl;
        exit(2);
    }

    if (url_.size() > 1500)
    {
        cout << "url is too long." << endl;
        exit(2);
    }

    if (url_.compare(0, 7, "http://") == 0)
    {
        isHTTP_ = true;    
    }
    else if (url_.compare(0, 8, "https://") == 0)
    {
        isHTTP_ = false;
    }
    else
    {
        cout << "Only HTTP/HTTPS protocol is directly supported." << endl;
        exit(2);
    }

    string tmp;

    if (isHTTP_)
        tmp = string(url_.begin()+7, url_.end());   // remove "http://"
    else
        tmp = string(url_.begin()+8, url_.end());   // remove "https://"

    auto pos = tmp.find("/");
    if (pos == string::npos)
    {
        host_ = tmp;
        uri_ = "/";
    }
    else
    {
        host_ = string(tmp.begin(), tmp.begin()+pos);
        uri_ = string(tmp.begin()+pos, tmp.end());
    }
}